

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::SubUsedBytes(PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
               *this,size_t bytes)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t lastTotalUsedBytes;
  size_t bytes_local;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *this_local;
  
  if (this->usedBytes < bytes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x8f2,"(bytes <= usedBytes)","bytes <= usedBytes");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (totalUsedBytes < bytes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x8f3,"(bytes <= totalUsedBytes)","bytes <= totalUsedBytes");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this->usedBytes = this->usedBytes - bytes;
  InterlockedExchangeAdd64((LONGLONG *)&totalUsedBytes,-bytes);
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::SubUsedBytes(size_t bytes)
{
    Assert(bytes <= usedBytes);
    Assert(bytes <= totalUsedBytes);

    usedBytes -= bytes;

#if defined(TARGET_64)
    size_t lastTotalUsedBytes = ::InterlockedExchangeAdd64((volatile LONG64 *)&totalUsedBytes, -(LONG64)bytes);
#else
    DWORD lastTotalUsedBytes = ::InterlockedExchangeSubtract(&totalUsedBytes, bytes);
#endif

    // ETW events from different threads may be reported out of order, producing an
    // incorrect representation of current used bytes in the process. We've determined that this is an
    // acceptable issue, which will be mitigated at the level of the application consuming the event.
    JS_ETW(EventWriteJSCRIPT_PAGE_ALLOCATOR_USED_SIZE(lastTotalUsedBytes - bytes));
#ifndef ENABLE_JS_ETW
    Unused(lastTotalUsedBytes);
#endif

#ifdef PERF_COUNTERS
    GetUsedSizeCounter() -= bytes;
    GetTotalUsedSizeCounter() -= bytes;
#endif
}